

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O0

int ImfHeaderSetBox2fAttribute
              (ImfHeader *hdr,char *name,float xMin,float yMin,float xMax,float yMax)

{
  bool bVar1;
  Header *this;
  iterator name_00;
  TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<float>_>_> *this_00;
  Box<Imath_3_2::Vec2<float>_> *pBVar2;
  ImfHeader *in_RDI;
  float in_XMM0_Da;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float in_XMM3_Da;
  char *in_stack_00000010;
  Header *in_stack_00000018;
  exception *e;
  Box2f box;
  Attribute *in_stack_000004f0;
  char *in_stack_000004f8;
  Header *in_stack_00000500;
  Header *in_stack_ffffffffffffff08;
  TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<float>_>_> *in_stack_ffffffffffffff10;
  Vec2<float> *in_stack_ffffffffffffff18;
  Box<Imath_3_2::Vec2<float>_> *in_stack_ffffffffffffff20;
  Vec2<float> local_48;
  Vec2<float> local_40 [3];
  float local_28;
  float local_24;
  ImfHeader *local_10;
  
  local_28 = in_XMM3_Da;
  local_24 = in_XMM2_Da;
  local_10 = in_RDI;
  Imath_3_2::Vec2<float>::Vec2(local_40,in_XMM0_Da,in_XMM1_Da);
  Imath_3_2::Vec2<float>::Vec2(&local_48,local_24,local_28);
  Imath_3_2::Box<Imath_3_2::Vec2<float>_>::Box
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
             (Vec2<float> *)in_stack_ffffffffffffff10);
  anon_unknown.dwarf_70604::header(local_10);
  Imf_3_4::Header::find(in_stack_00000018,in_stack_00000010);
  Imf_3_4::Header::ConstIterator::ConstIterator
            ((ConstIterator *)in_stack_ffffffffffffff10,(Iterator *)in_stack_ffffffffffffff08);
  this = anon_unknown.dwarf_70604::header(local_10);
  name_00._M_node = (_Base_ptr)Imf_3_4::Header::end(in_stack_ffffffffffffff08);
  Imf_3_4::Header::ConstIterator::ConstIterator
            ((ConstIterator *)in_stack_ffffffffffffff10,(Iterator *)in_stack_ffffffffffffff08);
  bVar1 = Imf_3_4::operator==((ConstIterator *)in_stack_ffffffffffffff10,
                              (ConstIterator *)in_stack_ffffffffffffff08);
  if (bVar1) {
    anon_unknown.dwarf_70604::header(local_10);
    Imf_3_4::TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<float>_>_>::TypedAttribute
              (in_stack_ffffffffffffff10,(Box<Imath_3_2::Vec2<float>_> *)in_stack_ffffffffffffff08);
    Imf_3_4::Header::insert(in_stack_00000500,in_stack_000004f8,in_stack_000004f0);
    Imf_3_4::TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<float>_>_>::~TypedAttribute
              ((TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<float>_>_> *)0x19c431);
  }
  else {
    anon_unknown.dwarf_70604::header(local_10);
    this_00 = Imf_3_4::Header::
              typedAttribute<Imf_3_4::TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<float>>>>
                        (this,(char *)name_00._M_node);
    pBVar2 = Imf_3_4::TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<float>_>_>::value(this_00);
    Imath_3_2::Box<Imath_3_2::Vec2<float>_>::operator=
              ((Box<Imath_3_2::Vec2<float>_> *)this_00,pBVar2);
  }
  return 1;
}

Assistant:

int
ImfHeaderSetBox2fAttribute (
    ImfHeader* hdr,
    const char name[],
    float      xMin,
    float      yMin,
    float      xMax,
    float      yMax)
{
    try
    {
        Box2f box (V2f (xMin, yMin), V2f (xMax, yMax));

        if (header (hdr)->find (name) == header (hdr)->end ())
        {
            header (hdr)->insert (
                name, OPENEXR_IMF_INTERNAL_NAMESPACE::Box2fAttribute (box));
        }
        else
        {
            header (hdr)
                ->typedAttribute<
                    OPENEXR_IMF_INTERNAL_NAMESPACE::Box2fAttribute> (name)
                .value () = box;
        }

        return 1;
    }
    catch (const std::exception& e)
    {
        setErrorMessage (e);
        return 0;
    }
}